

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_free(void *ptr)

{
  void *ptr_local;
  
  if ((ptr != (void *)0x0) && ((longdouble *)ptr != &on_malloc_zero)) {
    if (((ulong)ptr & 0x7fff) == 0x10) {
      big_free(ptr);
    }
    else {
      block_slice_free(ptr);
    }
  }
  return;
}

Assistant:

void fio_free(void *ptr) {
  if (!ptr || ptr == (void *)&on_malloc_zero)
    return;
  if (((uintptr_t)ptr & FIO_MEMORY_BLOCK_MASK) == 16) {
    /* big allocation - direct from the system */
    big_free(ptr);
    return;
  }
  /* allocated within block */
  block_slice_free(ptr);
}